

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  void *local_78;
  void *res;
  undefined1 local_68 [4];
  int stack_size;
  pthread_attr_t attr;
  thread_info *tinfo;
  int num_threads;
  int opt;
  int tnum;
  int s;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  res._4_4_ = 0x10000000;
  tinfo._0_4_ = argc + -1;
  _tnum = argv;
  argv_local._0_4_ = argc;
  fork();
  iVar1 = pthread_attr_init((pthread_attr_t *)local_68);
  opt = iVar1;
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    perror("pthread_attr_init");
    exit(1);
  }
  if ((0 < res._4_4_) &&
     (iVar1 = pthread_attr_setstacksize((pthread_attr_t *)local_68,(long)res._4_4_), iVar1 != 0)) {
    opt = iVar1;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    perror("pthread_attr_setstacksize");
    exit(1);
  }
  opt = 0;
  attr._48_8_ = calloc((long)(int)tinfo,0x18);
  if ((void *)attr._48_8_ == (void *)0x0) {
    perror("calloc");
    exit(1);
  }
  num_threads = 0;
  while( true ) {
    if ((int)tinfo <= num_threads) {
      iVar1 = pthread_attr_destroy((pthread_attr_t *)local_68);
      if (iVar1 != 0) {
        opt = iVar1;
        piVar2 = __errno_location();
        *piVar2 = iVar1;
        perror("pthread_attr_destroy");
        exit(1);
      }
      num_threads = 0;
      opt = 0;
      while( true ) {
        if ((int)tinfo <= num_threads) {
          free((void *)attr._48_8_);
          exit(0);
        }
        iVar1 = pthread_join(*(pthread_t *)(attr._48_8_ + (long)num_threads * 0x18),&local_78);
        opt = iVar1;
        if (iVar1 != 0) break;
        printf("Joined with thread %d; returned value was %s\n",
               (ulong)*(uint *)(attr._48_8_ + (long)num_threads * 0x18 + 8),local_78);
        free(local_78);
        num_threads = num_threads + 1;
      }
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      perror("pthread_join");
      exit(1);
    }
    *(int *)(attr._48_8_ + (long)num_threads * 0x18 + 8) = num_threads + 1;
    *(char **)(attr._48_8_ + (long)num_threads * 0x18 + 0x10) = _tnum[_optind + num_threads];
    iVar1 = pthread_create((pthread_t *)(attr._48_8_ + (long)num_threads * 0x18),
                           (pthread_attr_t *)local_68,thread_start,
                           (void *)(attr._48_8_ + (long)num_threads * 0x18));
    if (iVar1 != 0) break;
    num_threads = num_threads + 1;
    opt = 0;
  }
  opt = iVar1;
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  perror("pthread_create");
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    int s, tnum, opt, num_threads;
    struct thread_info *tinfo;
    pthread_attr_t attr;
    int stack_size;
    void *res;

    /* The "-s" option specifies a stack size for our threads */

    // Fix me, if stack_size != [0x10000000], always report below memory leak
    //leak memory [0x122c560, 304]back trace:
    //#1      0x7f8f69af5e55  /lib64/ld-linux-x86-64.so.2     _dl_allocate_tls
    //#2      0x7f8f696c9da1  /lib/x86_64-linux-gnu/libpthread.so.0   pthread_create
    //#3      0x4014dd        ./out/smtest    (nul)
    //#4      0x7f8f69018ec5  /lib/x86_64-linux-gnu/libc.so.6 __libc_start_main
    //#5      0x401129        ./out/smtest    (nul)
    stack_size = 0x10000000;
    num_threads = argc - 1;

    fork();

    /* Initialize thread creation attributes */

    s = pthread_attr_init(&attr);
    if (s != 0)
        handle_error_en(s, "pthread_attr_init");

    if (stack_size > 0) {
        s = pthread_attr_setstacksize(&attr, stack_size);
        if (s != 0)
            handle_error_en(s, "pthread_attr_setstacksize");
    }

    /* Allocate memory for pthread_create() arguments */

    tinfo = (struct thread_info*)calloc(num_threads, sizeof(struct thread_info));
    if (tinfo == NULL)
        handle_error("calloc");

    /* Create one thread for each command-line argument */

    for (tnum = 0; tnum < num_threads; tnum++) {
        tinfo[tnum].thread_num = tnum + 1;
        tinfo[tnum].argv_string = argv[optind + tnum];

        /* The pthread_create() call stores the thread ID into
           corresponding element of tinfo[] */

        s = pthread_create(&tinfo[tnum].thread_id, &attr,
                           &thread_start, &tinfo[tnum]);
        if (s != 0)
            handle_error_en(s, "pthread_create");
    }

    /* Destroy the thread attributes object, since it is no
       longer needed */

    s = pthread_attr_destroy(&attr);
    if (s != 0)
        handle_error_en(s, "pthread_attr_destroy");

    /* Now join with each thread, and display its returned value */

    for (tnum = 0; tnum < num_threads; tnum++) {
        s = pthread_join(tinfo[tnum].thread_id, &res);
        if (s != 0)
            handle_error_en(s, "pthread_join");

        printf("Joined with thread %d; returned value was %s\n",
                tinfo[tnum].thread_num, (char *) res);
        free(res);      /* Free memory allocated by thread */
    }

    free(tinfo);
    exit(EXIT_SUCCESS);
}